

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall
testing::AssertionResult::AssertionResult(AssertionResult *this,AssertionResult *other)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  pointer pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this->success_ = other->success_;
  pbVar2 = (other->message_).ptr_;
  if (pbVar2 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  else {
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20)
    ;
    (pbVar4->_M_dataplus)._M_p = (pointer)&pbVar4->field_2;
    pcVar3 = (pbVar2->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)pbVar4,pcVar3,pcVar3 + pbVar2->_M_string_length);
  }
  (this->message_).ptr_ = pbVar4;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

AssertionResult::AssertionResult(const AssertionResult& other)
    : success_(other.success_),
      message_(other.message_.get() != NULL ?
               new ::std::string(*other.message_) :
               static_cast< ::std::string*>(NULL)) {
}